

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O0

Address * __thiscall
cfd::AddressFactory::GetAddressByLockingScript(AddressFactory *this,Script *locking_script)

{
  bool bVar1;
  ScriptType SVar2;
  reference pvVar3;
  ScriptOperator *pSVar4;
  undefined8 uVar5;
  Script *in_RDX;
  Address *in_RDI;
  uint8_t var;
  ByteData160 hash_1;
  ByteData160 hash;
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  ByteData160 *in_stack_fffffffffffffdf8;
  WitnessVersion version;
  Pubkey *in_stack_fffffffffffffe00;
  AddressType AVar7;
  allocator *paVar6;
  AddressFactory *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe10;
  string *message;
  CfdError in_stack_fffffffffffffe1c;
  CfdException *in_stack_fffffffffffffe20;
  allocator local_1a1;
  string local_1a0 [38];
  undefined1 local_17a;
  undefined1 local_179 [33];
  ByteData local_158;
  char local_139;
  ByteData local_138;
  ByteData local_120;
  ByteData local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  ByteData160 local_d8;
  ByteData local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  ByteData160 local_90;
  undefined4 local_74;
  ByteData local_70;
  Pubkey local_58;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_30;
  Script *local_18;
  
  local_18 = in_RDX;
  core::Script::GetElementList(&local_30,in_RDX);
  bVar1 = core::Script::IsP2pkScript(local_18);
  if (bVar1) {
    pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
             operator[](&local_30,0);
    core::ScriptElement::GetBinaryData(&local_70,pvVar3);
    core::Pubkey::Pubkey(&local_58,&local_70);
    core::ByteData::~ByteData((ByteData *)0x525795);
    CreateP2pkhAddress(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    local_74 = 1;
    core::Pubkey::~Pubkey((Pubkey *)0x5257c6);
  }
  else {
    bVar1 = core::Script::IsP2pkhScript(local_18);
    if (bVar1) {
      pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
               operator[](&local_30,2);
      AVar7 = (AddressType)((ulong)in_stack_fffffffffffffe00 >> 0x20);
      core::ScriptElement::GetBinaryData(&local_c0,pvVar3);
      core::ByteData::GetBytes(&local_a8,&local_c0);
      core::ByteData160::ByteData160(&local_90,&local_a8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe10)
      ;
      core::ByteData::~ByteData((ByteData *)0x5258bc);
      GetAddressByHash(in_stack_fffffffffffffe08,AVar7,in_stack_fffffffffffffdf8);
      local_74 = 1;
      core::ByteData160::~ByteData160((ByteData160 *)0x5258f2);
    }
    else {
      bVar1 = core::Script::IsP2shScript(local_18);
      if (bVar1) {
        pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                 operator[](&local_30,1);
        AVar7 = (AddressType)((ulong)in_stack_fffffffffffffe00 >> 0x20);
        core::ScriptElement::GetBinaryData(&local_108,pvVar3);
        core::ByteData::GetBytes(&local_f0,&local_108);
        core::ByteData160::ByteData160(&local_d8,&local_f0);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffe10);
        core::ByteData::~ByteData((ByteData *)0x5259f2);
        GetAddressByHash(in_stack_fffffffffffffe08,AVar7,in_stack_fffffffffffffdf8);
        local_74 = 1;
        core::ByteData160::~ByteData160((ByteData160 *)0x525a28);
      }
      else {
        bVar1 = core::Script::IsP2wpkhScript(local_18);
        version = (WitnessVersion)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
        if ((bVar1) || (bVar1 = core::Script::IsP2wshScript(local_18), bVar1)) {
          pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ::operator[](&local_30,1);
          core::ScriptElement::GetBinaryData(&local_120,pvVar3);
          GetSegwitAddressByHash(in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->data_);
          core::ByteData::~ByteData((ByteData *)0x525b23);
          local_74 = 1;
        }
        else {
          bVar1 = core::Script::IsTaprootScript(local_18);
          if (!bVar1) {
            bVar1 = core::Script::IsWitnessProgram(local_18);
            if (bVar1) {
              pvVar3 = std::
                       vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::
                       operator[](&local_30,0);
              pSVar4 = core::ScriptElement::GetOpCode(pvVar3);
              bVar1 = core::ScriptOperator::operator!=
                                (pSVar4,(ScriptOperator *)core::ScriptOperator::OP_0);
              if (bVar1) {
                pvVar3 = std::
                         vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ::operator[](&local_30,0);
                pSVar4 = core::ScriptElement::GetOpCode(pvVar3);
                SVar2 = core::ScriptOperator::GetDataType(pSVar4);
                local_139 = (char)SVar2 + -0x51;
                pvVar3 = std::
                         vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ::operator[](&local_30,1);
                core::ScriptElement::GetBinaryData(&local_158,pvVar3);
                GetSegwitAddressByHash
                          (in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->data_,version);
                core::ByteData::~ByteData((ByteData *)0x525cf3);
                local_74 = 1;
                goto LAB_00525eec;
              }
            }
            bVar1 = core::Script::IsMultisigScript(local_18);
            if (bVar1) {
              local_17a = 1;
              uVar5 = __cxa_allocate_exception(0x30);
              message = (string *)local_179;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_179 + 1),"script type is multisig script.",
                         (allocator *)message);
              core::CfdException::CfdException
                        (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,message);
              local_17a = 0;
              __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            uVar5 = __cxa_allocate_exception(0x30);
            paVar6 = &local_1a1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1a0,"unknown type locking script.",paVar6);
            core::CfdException::CfdException
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe10
                      );
            __cxa_throw(uVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          pvVar3 = std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ::operator[](&local_30,1);
          core::ScriptElement::GetBinaryData(&local_138,pvVar3);
          GetSegwitAddressByHash
                    (in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->data_,version);
          core::ByteData::~ByteData((ByteData *)0x525bc8);
          local_74 = 1;
        }
      }
    }
  }
LAB_00525eec:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             in_stack_fffffffffffffe10);
  return in_RDI;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}